

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O1

void duckdb::CheckDistinctnessInternal
               (ValidityMask *valid,vector<std::reference_wrapper<duckdb::Vector>,_true> *sort_keys,
               idx_t count,
               map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
               *result)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  pointer prVar3;
  pointer prVar4;
  data_ptr_t pdVar5;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  byte bVar7;
  unsigned_long uVar8;
  key_type kVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  bool bVar12;
  vector<unsigned_long,std::allocator<unsigned_long>> *this;
  TemplatedValidityData<unsigned_long> *pTVar13;
  ulong uVar14;
  bool bVar15;
  pointer prVar16;
  vector<std::reference_wrapper<duckdb::Vector>,_true> *__range3;
  unsigned_long local_80;
  key_type local_78;
  uint local_6c;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  idx_t local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
  *local_40;
  vector<std::reference_wrapper<duckdb::Vector>,_true> *local_38;
  
  local_78 = 0;
  if (count != 0) {
    local_48 = &(valid->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_40 = result;
    local_38 = sort_keys;
    do {
      local_80 = local_78 + 1;
      if (local_80 < count) {
        local_6c = 0;
        do {
          puVar2 = (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) ||
             ((puVar2[local_80 >> 6] >> (local_80 & 0x3f) & 1) != 0)) {
            prVar3 = (local_38->
                     super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                     ).
                     super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            prVar4 = (local_38->
                     super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                     ).
                     super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (prVar3 != prVar4) {
              bVar15 = true;
              do {
                prVar16 = prVar3 + 1;
                pdVar5 = prVar3->_M_data->data;
                bVar12 = string_t::operator==
                                   ((string_t *)(pdVar5 + local_78 * 0x10),
                                    (string_t *)(pdVar5 + local_80 * 0x10));
                if (!bVar12) {
                  bVar15 = false;
                  break;
                }
                prVar3 = prVar16;
              } while (prVar16 != prVar4);
              if (!bVar15) goto LAB_016f0936;
            }
            this = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   ::std::
                   map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
                   ::operator[](local_40,&local_78);
            __position._M_current = *(unsigned_long **)(this + 8);
            if (__position._M_current == *(unsigned_long **)(this + 0x10)) {
              ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(this,__position,&local_80);
            }
            else {
              *__position._M_current = local_80;
              *(unsigned_long **)(this + 8) = __position._M_current + 1;
            }
            uVar8 = local_80;
            if ((valid->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                (unsigned_long *)0x0) {
              local_50 = (valid->super_TemplatedValidityMask<unsigned_long>).capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_50);
              p_Var11 = p_Stack_60;
              peVar10 = local_68;
              local_68 = (element_type *)0x0;
              p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var6 = (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar10;
              (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var11;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
              if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
              }
              pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_48);
              (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                   (unsigned_long *)
                   (pTVar13->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar7 = (byte)uVar8 & 0x3f;
            uVar14 = -2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7;
            puVar1 = (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                     (uVar8 >> 6);
            *puVar1 = *puVar1 & uVar14;
            local_6c = (uint)CONCAT71((int7)(uVar14 >> 8),1);
          }
LAB_016f0936:
          kVar9 = local_78;
          local_80 = local_80 + 1;
        } while (local_80 < count);
        if ((local_6c & 1) != 0) {
          if ((valid->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_50 = (valid->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_50);
            p_Var11 = p_Stack_60;
            peVar10 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var6 = (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar10;
            (valid->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var11;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
            }
            if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_48);
            (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar7 = (byte)kVar9 & 0x3f;
          puVar1 = (valid->super_TemplatedValidityMask<unsigned_long>).validity_mask + (kVar9 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
      }
      local_78 = local_78 + 1;
    } while (local_78 < count);
  }
  return;
}

Assistant:

static void CheckDistinctnessInternal(ValidityMask &valid, vector<reference<Vector>> &sort_keys, idx_t count,
                                      map<idx_t, vector<idx_t>> &result) {
	for (idx_t i = 0; i < count; i++) {
		bool has_conflicts = false;
		for (idx_t j = i + 1; j < count; j++) {
			if (!valid.RowIsValid(j)) {
				// Already a conflict
				continue;
			}
			bool matches = true;
			for (auto &sort_key : sort_keys) {
				auto &this_row = FlatVector::GetData<string_t>(sort_key.get())[i];
				auto &other_row = FlatVector::GetData<string_t>(sort_key.get())[j];
				if (this_row != other_row) {
					matches = false;
					break;
				}
			}
			if (matches) {
				auto &row_ids = result[i];
				has_conflicts = true;
				row_ids.push_back(j);
				valid.SetInvalid(j);
			}
		}
		if (has_conflicts) {
			valid.SetInvalid(i);
		}
	}
}